

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

int ASN1_INTEGER_cmp(ASN1_INTEGER *x,ASN1_INTEGER *y)

{
  uint uVar1;
  int ret;
  int neg;
  ASN1_INTEGER *y_local;
  ASN1_INTEGER *x_local;
  
  uVar1 = x->type & 0x100;
  if (uVar1 == (y->type & 0x100U)) {
    x_local._4_4_ = ASN1_STRING_cmp(x,y);
    if (uVar1 != 0) {
      if (x_local._4_4_ < 0) {
        x_local._4_4_ = 1;
      }
      else if (x_local._4_4_ < 1) {
        x_local._4_4_ = 0;
      }
      else {
        x_local._4_4_ = -1;
      }
    }
  }
  else {
    x_local._4_4_ = 1;
    if (uVar1 != 0) {
      x_local._4_4_ = -1;
    }
  }
  return x_local._4_4_;
}

Assistant:

int ASN1_INTEGER_cmp(const ASN1_INTEGER *x, const ASN1_INTEGER *y) {
  // Compare signs.
  int neg = x->type & V_ASN1_NEG;
  if (neg != (y->type & V_ASN1_NEG)) {
    return neg ? -1 : 1;
  }

  int ret = ASN1_STRING_cmp(x, y);
  if (neg) {
    // This could be |-ret|, but |ASN1_STRING_cmp| is not forbidden from
    // returning |INT_MIN|.
    if (ret < 0) {
      return 1;
    } else if (ret > 0) {
      return -1;
    } else {
      return 0;
    }
  }

  return ret;
}